

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_t sVar4;
  string *extraout_RAX;
  string *psVar5;
  string *psVar6;
  char *__s;
  StringPiece SVar7;
  string basename;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char local_38 [16];
  
  local_48._M_allocated_capacity = (size_type)(filename->_M_dataplus)._M_p;
  local_48._8_8_ = filename->_M_string_length;
  if ((long)local_48._8_8_ < 0xb) {
LAB_00275f94:
    __s = ".proto";
  }
  else {
    SVar7 = StringPiece::substr((StringPiece *)&local_48,(size_type)(local_48._8_8_ + -0xb),
                                0xffffffffffffffff);
    plVar3 = (long *)SVar7.ptr_;
    if ((SVar7.length_ != 0xb) ||
       ((__s = ".protodevel", plVar3 != (long *)".protodevel" &&
        (*(long *)((long)plVar3 + 3) != 0x6c657665646f746f || *plVar3 != 0x65646f746f72702e))))
    goto LAB_00275f94;
  }
  local_48._M_allocated_capacity = (size_type)local_38;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar4);
  psVar6 = (string *)filename->_M_string_length;
  if ((ulong)local_48._8_8_ <= psVar6) {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)psVar6 - local_48._8_8_,(string *)local_48._8_8_);
    psVar6 = (string *)filename->_M_string_length;
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)filename);
      goto LAB_00276004;
    }
  }
  local_68._0_8_ = local_68 + 0x10;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,pcVar1,psVar6 + (long)pcVar1);
LAB_00276004:
  if ((char *)local_48._M_allocated_capacity != local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  ReplaceCharacters((string *)local_68,"-",'_');
  ReplaceCharacters((string *)local_68,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_68._0_8_,
             (pointer)(local_68._0_8_ + local_68._8_8_));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar5 = (string *)(local_68 + 0x10);
  if ((string *)local_68._0_8_ != psVar5) {
    operator_delete((void *)local_68._0_8_);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

std::string ModuleName(const std::string& filename) {
  std::string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}